

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadMemory(BinaryReader *this,Limits *out_page_limits)

{
  Result RVar1;
  ulong uVar2;
  Enum EVar3;
  char *format;
  uint8_t flags;
  uint64_t max;
  uint32_t max32;
  uint32_t initial32;
  uint64_t initial;
  
  max = 0;
  RVar1 = ReadU8(this,&flags,"memory flags");
  EVar3 = Error;
  if (RVar1.enum_ == Error) {
    return (Result)Error;
  }
  if (7 < flags) {
    PrintError(this,"malformed memory limits flag: %d",(ulong)(uint)flags);
    return (Result)Error;
  }
  if (((flags & 2) == 0) || ((this->options_->features).threads_enabled_ != false)) {
    if ((flags & 4) == 0) {
      RVar1 = ReadU32Leb128(this,&initial32,"memory initial page count");
      if (RVar1.enum_ == Error) {
        return (Result)Error;
      }
      initial = (uint64_t)initial32;
      if ((flags & 1) == 0) {
LAB_00126cf4:
        uVar2 = 0;
      }
      else {
        RVar1 = ReadU32Leb128(this,&max32,"memory max page count");
        if (RVar1.enum_ == Error) {
          return (Result)Error;
        }
        max = (uint64_t)max32;
        uVar2 = max;
      }
    }
    else {
      if ((this->options_->features).memory64_enabled_ == false) {
        format = "memory64 not allowed";
        goto LAB_00126d3b;
      }
      RVar1 = ReadU64Leb128(this,&initial,"memory initial page count");
      if (RVar1.enum_ == Error) {
        return (Result)Error;
      }
      if ((flags & 1) == 0) goto LAB_00126cf4;
      RVar1 = ReadU64Leb128(this,&max,"memory max page count");
      uVar2 = max;
      if (RVar1.enum_ == Error) {
        return (Result)Error;
      }
    }
    out_page_limits->has_max = (bool)(flags & 1);
    out_page_limits->is_shared = SUB41((flags & 2) >> 1,0);
    out_page_limits->is_64 = SUB41((flags & 4) >> 2,0);
    out_page_limits->initial = initial;
    out_page_limits->max = uVar2;
    std::vector<wabt::Limits,_std::allocator<wabt::Limits>_>::push_back
              (&this->memories,out_page_limits);
    EVar3 = Ok;
  }
  else {
    format = "memory may not be shared: threads not allowed";
LAB_00126d3b:
    PrintError(this,format);
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReader::ReadMemory(Limits* out_page_limits) {
  uint8_t flags;
  uint64_t initial;
  uint64_t max = 0;
  CHECK_RESULT(ReadU8(&flags, "memory flags"));
  bool has_max = flags & WABT_BINARY_LIMITS_HAS_MAX_FLAG;
  bool is_shared = flags & WABT_BINARY_LIMITS_IS_SHARED_FLAG;
  bool is_64 = flags & WABT_BINARY_LIMITS_IS_64_FLAG;
  const uint8_t unknown_flags = flags & ~WABT_BINARY_LIMITS_ALL_FLAGS;
  ERROR_UNLESS(unknown_flags == 0, "malformed memory limits flag: %d", flags);
  ERROR_IF(is_shared && !options_.features.threads_enabled(),
           "memory may not be shared: threads not allowed");
  ERROR_IF(is_64 && !options_.features.memory64_enabled(),
           "memory64 not allowed");
  if (is_64) {
    CHECK_RESULT(ReadU64Leb128(&initial, "memory initial page count"));
    if (has_max) {
      CHECK_RESULT(ReadU64Leb128(&max, "memory max page count"));
    }
  } else {
    uint32_t initial32;
    CHECK_RESULT(ReadU32Leb128(&initial32, "memory initial page count"));
    initial = initial32;
    if (has_max) {
      uint32_t max32;
      CHECK_RESULT(ReadU32Leb128(&max32, "memory max page count"));
      max = max32;
    }
  }

  out_page_limits->has_max = has_max;
  out_page_limits->is_shared = is_shared;
  out_page_limits->is_64 = is_64;
  out_page_limits->initial = initial;
  out_page_limits->max = max;

  // Have to keep a copy of these, to know how to interpret load/stores.
  memories.push_back(*out_page_limits);
  return Result::Ok;
}